

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QList<std::pair<int,_int>_> * __thiscall
QTreeViewPrivate::columnRanges
          (QTreeViewPrivate *this,QModelIndex *topIndex,QModelIndex *bottomIndex)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int *piVar4;
  QList<std::pair<int,_int>_> *this_00;
  qsizetype qVar5;
  const_reference piVar6;
  QModelIndex *in_RCX;
  QModelIndex *in_RDX;
  long in_RSI;
  QHeaderView *in_RDI;
  long in_FS_OFFSET;
  int logicalColumn;
  int i;
  int logical;
  int c;
  int end;
  int start;
  QList<std::pair<int,_int>_> *ret;
  pair<int,_int> current;
  QList<int> logicalIndexes;
  int bottomVisual;
  int topVisual;
  undefined4 in_stack_ffffffffffffff48;
  parameter_type in_stack_ffffffffffffff4c;
  QList<int> *in_stack_ffffffffffffff50;
  iterator __last;
  iterator __first;
  QHeaderView *in_stack_ffffffffffffff78;
  QHeaderView *this_01;
  int local_78;
  int local_5c;
  pair<int,_int> local_30;
  QList<int> local_28;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __first.i = *(int **)(in_RSI + 0x590);
  __last.i = (int *)in_RDI;
  QModelIndex::column(in_RDX);
  local_c = QHeaderView::visualIndex(in_stack_ffffffffffffff78,(int)((ulong)in_RSI >> 0x20));
  this_01 = *(QHeaderView **)(in_RSI + 0x590);
  QModelIndex::column(in_RCX);
  local_10 = QHeaderView::visualIndex(this_01,(int)((ulong)in_RSI >> 0x20));
  piVar4 = qMin<int>(&local_c,&local_10);
  local_5c = *piVar4;
  piVar4 = qMax<int>(&local_c,&local_10);
  iVar1 = *piVar4;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x900c13);
  for (; local_5c <= iVar1; local_5c = local_5c + 1) {
    QHeaderView::logicalIndex(in_RDI,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    bVar3 = QHeaderView::isSectionHidden((QHeaderView *)__first.i,(int)((ulong)__last.i >> 0x20));
    if (!bVar3) {
      QList<int>::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
  }
  QList<int>::begin(in_stack_ffffffffffffff50);
  QList<int>::end(in_stack_ffffffffffffff50);
  std::sort<QList<int>::iterator>(__first,__last);
  *(undefined1 **)
   &(in_RDI->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &(in_RDI->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8
       = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)
   &(in_RDI->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
    super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<int,_int>_>::QList((QList<std::pair<int,_int>_> *)0x900cdb);
  local_30 = (pair<int,_int>)&DAT_aaaaaaaaaaaaaaaa;
  std::pair<int,_int>::pair<int,_int,_true>(&local_30);
  local_30.first = -2;
  local_30.second = -2;
  local_78 = 0;
  while( true ) {
    this_00 = (QList<std::pair<int,_int>_> *)(long)local_78;
    qVar5 = QList<int>::size(&local_28);
    if (qVar5 <= (long)this_00) break;
    piVar6 = QList<int>::at((QList<int> *)this_00,
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    iVar1 = *piVar6;
    if (local_30.second + 1 == iVar1) {
      iVar1 = local_30.first;
      iVar2 = local_30.second + 1;
    }
    else {
      iVar2 = iVar1;
      if (local_30.first != -2) {
        QList<std::pair<int,_int>_>::operator+=
                  (this_00,(parameter_type)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
    }
    local_30.second = iVar2;
    local_30.first = iVar1;
    local_78 = local_78 + 1;
  }
  if (local_30.first != -2) {
    QList<std::pair<int,_int>_>::operator+=
              (this_00,(parameter_type)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
              );
  }
  QList<int>::~QList((QList<int> *)0x900df3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<std::pair<int,_int>_> *)__last.i;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<int, int>> QTreeViewPrivate::columnRanges(const QModelIndex &topIndex,
                                                          const QModelIndex &bottomIndex) const
{
    const int topVisual = header->visualIndex(topIndex.column()),
        bottomVisual = header->visualIndex(bottomIndex.column());

    const int start = qMin(topVisual, bottomVisual);
    const int end = qMax(topVisual, bottomVisual);

    QList<int> logicalIndexes;

    //we iterate over the visual indexes to get the logical indexes
    for (int c = start; c <= end; c++) {
        const int logical = header->logicalIndex(c);
        if (!header->isSectionHidden(logical)) {
            logicalIndexes << logical;
        }
    }
    //let's sort the list
    std::sort(logicalIndexes.begin(), logicalIndexes.end());

    QList<std::pair<int, int>> ret;
    std::pair<int, int> current;
    current.first = -2; // -1 is not enough because -1+1 = 0
    current.second = -2;
    for(int i = 0; i < logicalIndexes.size(); ++i) {
        const int logicalColumn = logicalIndexes.at(i);
        if (current.second + 1 != logicalColumn) {
            if (current.first != -2) {
                //let's save the current one
                ret += current;
            }
            //let's start a new one
            current.first = current.second = logicalColumn;
        } else {
            current.second++;
        }
    }

    //let's get the last range
    if (current.first != -2) {
        ret += current;
    }

    return ret;
}